

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_connection.c
# Opt level: O0

apx_error_t
create_new_node_instance
          (apx_serverConnection_t *self,apx_nodeManager_t *node_manager,apx_file_t *definition_file)

{
  uint32_t address;
  apx_error_t aVar1;
  rmf_fileInfo_t *file_info_00;
  apx_nodeInstance_tag *self_00;
  apx_fileManager_t *self_01;
  apx_fileManager_t *file_manager;
  apx_nodeInstance_t *node_instance;
  rmf_fileInfo_t *file_info;
  _Bool file_open_request;
  apx_file_t *paStack_28;
  apx_error_t retval;
  apx_file_t *definition_file_local;
  apx_nodeManager_t *node_manager_local;
  apx_serverConnection_t *self_local;
  
  file_info._4_4_ = 0;
  paStack_28 = definition_file;
  definition_file_local = (apx_file_t *)node_manager;
  node_manager_local = (apx_nodeManager_t *)self;
  if (((self != (apx_serverConnection_t *)0x0) && (node_manager != (apx_nodeManager_t *)0x0)) &&
     (definition_file != (apx_file_t *)0x0)) {
    file_info._3_1_ = 0;
    file_info_00 = apx_file_get_file_info(definition_file);
    file_info._4_4_ =
         apx_nodeManager_init_node_from_file_info
                   ((apx_nodeManager_t *)definition_file_local,file_info_00,
                    (_Bool *)((long)&file_info + 3));
    if (file_info._4_4_ == 0) {
      self_00 = apx_nodeManager_get_last_attached((apx_nodeManager_t *)definition_file_local);
      if (self_00 != (apx_nodeInstance_tag *)0x0) {
        apx_nodeInstance_remote_file_published_notification(self_00,paStack_28);
      }
      if ((file_info._3_1_ & 1) == 0) {
        file_info._4_4_ = 0xb;
      }
      else {
        self_01 = apx_connectionBase_get_file_manager((apx_connectionBase_t *)node_manager_local);
        if (self_01 != (apx_fileManager_t *)0x0) {
          apx_file_open(paStack_28);
          apx_nodeInstance_set_definition_data_state(self_00,'\x03');
          address = apx_file_get_address_without_flags(paStack_28);
          aVar1 = apx_fileManager_send_open_file_request(self_01,address);
          return aVar1;
        }
      }
    }
    return file_info._4_4_;
  }
  __assert_fail("(self != NULL) && (node_manager != NULL) && (definition_file != NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                ,0x184,
                "apx_error_t create_new_node_instance(apx_serverConnection_t *, apx_nodeManager_t *, apx_file_t *)"
               );
}

Assistant:

static apx_error_t create_new_node_instance(apx_serverConnection_t* self, apx_nodeManager_t* node_manager, apx_file_t* definition_file)
{
   apx_error_t retval = APX_NO_ERROR;
   assert( (self != NULL) && (node_manager != NULL) && (definition_file != NULL) );
   bool file_open_request = false;
   rmf_fileInfo_t const* file_info = apx_file_get_file_info(definition_file);
   retval = apx_nodeManager_init_node_from_file_info(node_manager, file_info, &file_open_request);
   if (retval == APX_NO_ERROR)
   {
      apx_nodeInstance_t* node_instance = apx_nodeManager_get_last_attached(node_manager);
      if (node_instance != NULL)
      {
         apx_nodeInstance_remote_file_published_notification(node_instance, definition_file);
      }
      if (file_open_request)
      {
         apx_fileManager_t* file_manager = apx_connectionBase_get_file_manager(&self->base);
         if (file_manager != NULL)
         {
            apx_file_open(definition_file); //Should this be moved into file_manager?
            apx_nodeInstance_set_definition_data_state(node_instance, APX_DATA_STATE_WAITING_FOR_FILE_DATA);
            return apx_fileManager_send_open_file_request(file_manager, apx_file_get_address_without_flags(definition_file));
         }
      }
      else
      {
         retval = APX_NOT_IMPLEMENTED_ERROR; //Retriving data from cache not yet implemented
      }
   }
   return retval;
}